

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ErrorResilienceTestLarge_OnVersusOff_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ErrorResilienceTestLarge_OnVersusOff_Test>
           *this)

{
  ErrorResilienceTestLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int>>::
  parameter_ = &this->parameter_;
  this_00 = (ErrorResilienceTestLarge *)operator_new(0x590);
  anon_unknown.dwarf_776fc3::ErrorResilienceTestLarge::ErrorResilienceTestLarge(this_00);
  (this_00->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__ErrorResilienceTestLarge_0104abd0;
  (this_00->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ErrorResilienceTestLarge_OnVersusOff_Test_0104ac50
  ;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__ErrorResilienceTestLarge_OnVersusOff_Test_0104ac70;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }